

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommonTargetGenerator.cxx
# Opt level: O3

void __thiscall
cmCommonTargetGenerator::AppendOSXVerFlag
          (cmCommonTargetGenerator *this,string *flags,string *lang,char *name,bool so)

{
  cmLocalCommonGenerator *pcVar1;
  char *__s;
  size_t sVar2;
  ostream *poVar3;
  int patch;
  int minor;
  int major;
  string fvar;
  ostringstream vflag;
  int local_1f4;
  int local_1f0;
  int local_1ec;
  string local_1e8;
  long *local_1c8 [2];
  long local_1b8 [2];
  undefined1 local_1a8 [376];
  
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"CMAKE_","");
  std::__cxx11::string::_M_append((char *)&local_1e8,(ulong)(lang->_M_dataplus)._M_p);
  std::__cxx11::string::append((char *)&local_1e8);
  std::__cxx11::string::append((char *)&local_1e8);
  std::__cxx11::string::append((char *)&local_1e8);
  __s = cmMakefile::GetDefinition(this->Makefile,&local_1e8);
  if (__s != (char *)0x0) {
    cmGeneratorTarget::GetTargetVersion(this->GeneratorTarget,so,&local_1ec,&local_1f0,&local_1f4);
    if (((0 < local_1ec) || (0 < local_1f0)) || (0 < local_1f4)) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      sVar2 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s,sVar2);
      poVar3 = (ostream *)std::ostream::operator<<(local_1a8,local_1ec);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,".",1);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_1f0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,".",1);
      std::ostream::operator<<(poVar3,local_1f4);
      pcVar1 = this->LocalCommonGenerator;
      std::__cxx11::stringbuf::str();
      (*(pcVar1->super_cmLocalGenerator)._vptr_cmLocalGenerator[6])(pcVar1,flags,local_1c8);
      if (local_1c8[0] != local_1b8) {
        operator_delete(local_1c8[0],local_1b8[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmCommonTargetGenerator::AppendOSXVerFlag(std::string& flags,
                                               const std::string& lang,
                                               const char* name, bool so)
{
  // Lookup the flag to specify the version.
  std::string fvar = "CMAKE_";
  fvar += lang;
  fvar += "_OSX_";
  fvar += name;
  fvar += "_VERSION_FLAG";
  const char* flag = this->Makefile->GetDefinition(fvar);

  // Skip if no such flag.
  if (!flag) {
    return;
  }

  // Lookup the target version information.
  int major;
  int minor;
  int patch;
  this->GeneratorTarget->GetTargetVersion(so, major, minor, patch);
  if (major > 0 || minor > 0 || patch > 0) {
    // Append the flag since a non-zero version is specified.
    std::ostringstream vflag;
    vflag << flag << major << "." << minor << "." << patch;
    this->LocalCommonGenerator->AppendFlags(flags, vflag.str());
  }
}